

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metalog.h
# Opt level: O0

void __thiscall MetaLog<deflog>::MetaLog(MetaLog<deflog> *this)

{
  MultiStreamWriter<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::basic_ofstream<char,_std::char_traits<char>_>_*>
  *this_00;
  MetaLog<deflog> *this_local;
  
  std::
  vector<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ::vector(&this->latest_);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set(&this->hash_set_);
  this->dout_ = (ostream *)&std::cout;
  this->fout_ = (ofstream *)0x0;
  this_00 = (MultiStreamWriter<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::basic_ofstream<char,_std::char_traits<char>_>_*>
             *)operator_new(0x18);
  MultiStreamWriter<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::basic_ofstream<char,_std::char_traits<char>_>_*>
  ::MultiStreamWriter(this_00,this->dout_,this->fout_);
  this->mwriter_ = this_00;
  this->max_log_level_ = VERBOSE;
  return;
}

Assistant:

constexpr MetaLog() {
		dout_ = &std::cout;
		fout_ = nullptr;
		mwriter_ = new MultiStreamWriter<decltype(dout_), decltype(fout_)>(dout_, fout_);
		max_log_level_ = static_cast<typename T::type>(0);
		static_assert(std::is_convertible<typename T::type, int>::value, "selected log type enum should be convertible to int");
	}